

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin.c
# Opt level: O2

int coda_bin_close(coda_product *product)

{
  coda_bin_product_close((coda_bin_product *)product);
  free(product->filename);
  free(product);
  return 0;
}

Assistant:

int coda_bin_close(coda_product *product)
{
    coda_bin_product *product_file = (coda_bin_product *)product;

    if (coda_bin_product_close(product_file) != 0)
    {
        return -1;
    }

    if (product_file->filename != NULL)
    {
        free(product_file->filename);
    }

    free(product_file);

    return 0;
}